

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

int ps_load_dict(ps_decoder_t *ps,char *dictfile,char *fdictfile,char *format)

{
  long *plVar1;
  int iVar2;
  ps_config_t *config;
  dict_t *dict;
  dict2pid_t *pdVar3;
  hash_iter_t *itor;
  
  config = ps_config_init((ps_arg_t *)0x0);
  iVar2 = ps_config_bool(ps->config,"dictcase");
  ps_config_set_bool(config,"dictcase",iVar2);
  ps_config_set_str(config,"dict",dictfile);
  if (fdictfile == (char *)0x0) {
    fdictfile = ps_config_str(ps->config,"fdict");
  }
  ps_config_set_str(config,"fdict",fdictfile);
  dict = dict_init(config,ps->acmod->mdef);
  if (dict == (dict_t *)0x0) {
    ps_config_free(config);
    iVar2 = -1;
  }
  else {
    pdVar3 = dict2pid_build(ps->acmod->mdef,dict);
    ps_config_free(config);
    iVar2 = -1;
    if (pdVar3 != (dict2pid_t *)0x0) {
      dict_free(ps->dict);
      ps->dict = dict;
      dict2pid_free(ps->d2p);
      ps->d2p = pdVar3;
      for (itor = hash_table_iter(ps->searches); itor != (hash_iter_t *)0x0;
          itor = hash_table_iter_next(itor)) {
        plVar1 = (long *)itor->ent->val;
        iVar2 = (**(code **)(*plVar1 + 0x18))(plVar1,dict,pdVar3);
        if (iVar2 < 0) {
          hash_table_iter_free(itor);
          return -1;
        }
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
ps_load_dict(ps_decoder_t *ps, char const *dictfile,
             char const *fdictfile, char const *format)
{
    dict2pid_t *d2p;
    dict_t *dict;
    hash_iter_t *search_it;
    ps_config_t *newconfig;

    (void)format;
    /* Create a new scratch config to load this dict (so existing one
     * won't be affected if it fails) */
    newconfig = ps_config_init(NULL);
    ps_config_set_bool(newconfig, "dictcase",
                       ps_config_bool(ps->config, "dictcase"));
    ps_config_set_str(newconfig, "dict", dictfile);
    if (fdictfile)
        ps_config_set_str(newconfig, "fdict", fdictfile);
    else
        ps_config_set_str(newconfig, "fdict",
                          ps_config_str(ps->config, "fdict"));

    /* Try to load it. */
    if ((dict = dict_init(newconfig, ps->acmod->mdef)) == NULL) {
        ps_config_free(newconfig);
        return -1;
    }

    /* Reinit the dict2pid. */
    if ((d2p = dict2pid_build(ps->acmod->mdef, dict)) == NULL) {
        ps_config_free(newconfig);
        return -1;
    }

    /* Success!  Update the existing config to reflect new dicts and
     * drop everything into place. */
    ps_config_free(newconfig);
    dict_free(ps->dict);
    ps->dict = dict;
    dict2pid_free(ps->d2p);
    ps->d2p = d2p;

    /* And tell all searches to reconfigure themselves. */
    for (search_it = hash_table_iter(ps->searches); search_it;
       search_it = hash_table_iter_next(search_it)) {
        if (ps_search_reinit(hash_entry_val(search_it->ent), dict, d2p) < 0) {
            hash_table_iter_free(search_it);
            return -1;
        }
    }

    return 0;
}